

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

MockSpec<BasicTestExpr<2>_(BasicTestExpr<2>)> * __thiscall
testing::internal::FunctionMocker<BasicTestExpr<2>_(BasicTestExpr<2>)>::With
          (FunctionMocker<BasicTestExpr<2>_(BasicTestExpr<2>)> *this,Matcher<BasicTestExpr<2>_> *m1)

{
  linked_ptr_internal lVar1;
  linked_ptr<const_testing::MatcherInterface<BasicTestExpr<2>_>_> local_28;
  
  local_28.value_ = (m1->super_MatcherBase<BasicTestExpr<2>_>).impl_.value_;
  lVar1.next_ = &local_28.link_;
  if (local_28.value_ != (MatcherInterface<BasicTestExpr<2>_> *)0x0) {
    linked_ptr_internal::join
              (&local_28.link_,&(m1->super_MatcherBase<BasicTestExpr<2>_>).impl_.link_);
    lVar1.next_ = local_28.link_.next_;
  }
  local_28.link_.next_ = lVar1.next_;
  linked_ptr<const_testing::MatcherInterface<BasicTestExpr<2>_>_>::operator=
            ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<2>_>_> *)
             ((long)&(this->super_FunctionMockerBase<BasicTestExpr<2>_(BasicTestExpr<2>)>).
                     current_spec_.matchers_.
                     super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>_>.
                     super__Head_base<0UL,_testing::Matcher<BasicTestExpr<2>_>,_false>._M_head_impl.
                     super_MatcherBase<BasicTestExpr<2>_> + 8),&local_28);
  linked_ptr<const_testing::MatcherInterface<BasicTestExpr<2>_>_>::~linked_ptr(&local_28);
  return &(this->super_FunctionMockerBase<BasicTestExpr<2>_(BasicTestExpr<2>)>).current_spec_;
}

Assistant:

MockSpec<F>& With(const Matcher<A1>& m1) {
    this->current_spec().SetMatchers(::std::tr1::make_tuple(m1));
    return this->current_spec();
  }